

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
trieste::Reader::Reader
          (Reader *this,string *language_name,
          vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *passes,Parse *parser)

{
  pointer pcVar1;
  
  (this->language_name_)._M_dataplus._M_p = (pointer)&(this->language_name_).field_2;
  pcVar1 = (language_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + language_name->_M_string_length);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  vector(&this->passes_,passes);
  Parse::Parse(&this->parser_,parser);
  (this->input_).
  super__Optional_base<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>_>
  ._M_engaged = false;
  this->debug_enabled_ = false;
  this->wf_check_enabled_ = false;
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            ((path *)&this->debug_path_,(char (*) [2])0x268f9b,auto_format);
  (this->start_pass_)._M_dataplus._M_p = (pointer)&(this->start_pass_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->start_pass_,"");
  (this->end_pass_)._M_dataplus._M_p = (pointer)&(this->end_pass_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->end_pass_,"");
  this->offset_ = 0;
  return;
}

Assistant:

Reader(
      const std::string& language_name,
      const std::vector<Pass>& passes,
      const Parse& parser)
    : language_name_(language_name),
      passes_(passes),
      parser_(parser),
      debug_enabled_(false),
      wf_check_enabled_(false),
      debug_path_("."),
      start_pass_(""),
      end_pass_(""),
      offset_(0)
    {}